

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_TextureMapping::GetTextureCoordinates
          (ON_TextureMapping *this,ON_Mesh *mesh,ON_SimpleArray<ON_2fPoint> *T,ON_Xform *mesh_xform,
          bool bLazy,ON_SimpleArray<int> *Tside)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ON_2fPoint *pOVar4;
  ON_TextureCoordinates *pOVar5;
  ON_2fPoint *pOVar6;
  undefined1 local_68 [8];
  ON_SimpleArray<ON_3fPoint> T3;
  int tccount;
  int tci;
  int vcnt;
  bool rc;
  ON_SimpleArray<int> *Tside_local;
  bool bLazy_local;
  ON_Xform *mesh_xform_local;
  ON_SimpleArray<ON_2fPoint> *T_local;
  ON_Mesh *mesh_local;
  ON_TextureMapping *this_local;
  
  if (Tside != (ON_SimpleArray<int> *)0x0) {
    ON_SimpleArray<int>::SetCount(Tside,0);
  }
  if (bLazy) {
    bVar1 = HasMatchingTextureCoordinates(this,mesh,mesh_xform);
    if (bVar1) {
      pOVar6 = ON_SimpleArray<ON_2fPoint>::Array(T);
      pOVar4 = ON_SimpleArray<ON_2fPoint>::Array(&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
      if (pOVar6 != pOVar4) {
        ON_SimpleArray<ON_2fPoint>::operator=(T,&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>);
      }
      return true;
    }
    iVar2 = ON_SimpleArray<ON_3fPoint>::Count(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
    T3.m_count = ON_ClassArray<ON_TextureCoordinates>::Count(&mesh->m_TC);
    for (T3.m_capacity = 0; T3.m_capacity < T3.m_count; T3.m_capacity = T3.m_capacity + 1) {
      pOVar5 = ON_ClassArray<ON_TextureCoordinates>::operator[](&mesh->m_TC,T3.m_capacity);
      iVar3 = ON_SimpleArray<ON_3fPoint>::Count(&pOVar5->m_T);
      if (iVar2 == iVar3) {
        pOVar5 = ON_ClassArray<ON_TextureCoordinates>::operator[](&mesh->m_TC,T3.m_capacity);
        bVar1 = HasMatchingTextureCoordinates(this,&pOVar5->m_tag,mesh_xform);
        if (bVar1) {
          pOVar5 = ON_ClassArray<ON_TextureCoordinates>::operator[](&mesh->m_TC,T3.m_capacity);
          ThreeToTwoHelper(&pOVar5->m_T,T);
          return true;
        }
      }
    }
  }
  if (this->m_type == srfp_mapping) {
    bVar1 = ON_Mesh::HasSurfaceParameters(mesh);
    if (bVar1) {
      iVar2 = ON_SimpleArray<ON_3fPoint>::Count(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
      ON_SimpleArray<ON_2fPoint>::Reserve(T,(long)iVar2);
      iVar2 = ON_SimpleArray<ON_3fPoint>::Count(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>);
      ON_SimpleArray<ON_2fPoint>::SetCount(T,iVar2);
      ON_SimpleArray<ON_2fPoint>::Zero(T);
      pOVar6 = ON_SimpleArray<ON_2fPoint>::operator[](T,0);
      tci._3_1_ = GetSPTCHelper(mesh,this,&pOVar6->x,2);
    }
    else {
      tci._3_1_ = false;
    }
  }
  else {
    ON_SimpleArray<ON_2fPoint>::SetCount(T,0);
    ON_SimpleArray<ON_3fPoint>::ON_SimpleArray((ON_SimpleArray<ON_3fPoint> *)local_68);
    tci._3_1_ = GetTextureCoordinates
                          (this,mesh,(ON_SimpleArray<ON_3fPoint> *)local_68,mesh_xform,false,Tside);
    if (tci._3_1_) {
      ThreeToTwoHelper((ON_SimpleArray<ON_3fPoint> *)local_68,T);
    }
    ON_SimpleArray<ON_3fPoint>::~ON_SimpleArray((ON_SimpleArray<ON_3fPoint> *)local_68);
  }
  return tci._3_1_;
}

Assistant:

bool ON_TextureMapping::GetTextureCoordinates(
            const ON_Mesh& mesh,
            ON_SimpleArray<ON_2fPoint>& T,
            const ON_Xform* mesh_xform,
            bool bLazy,
            ON_SimpleArray<int>* Tside
            ) const
{
  bool rc = false;
  if ( Tside )
    Tside->SetCount(0);
  if ( bLazy )
  {
    if ( HasMatchingTextureCoordinates(mesh,mesh_xform ) )
    {
      if ( T.Array() != mesh.m_T.Array() )
      {
        // different arrays - copy
        T = mesh.m_T;
      }
      return true;
    }
    else
    {
      int vcnt = mesh.m_V.Count();
      int tci, tccount = mesh.m_TC.Count();
      for ( tci = 0; tci < tccount; tci++ )
      {
        if ( vcnt == mesh.m_TC[tci].m_T.Count() )
        {
          if ( HasMatchingTextureCoordinates(mesh.m_TC[tci].m_tag,mesh_xform) )
          {
            // copy T3d[] results to T[]
            ThreeToTwoHelper(mesh.m_TC[tci].m_T,T);
            return true;
          }
        }
      }
    }
  }

  if ( ON_TextureMapping::TYPE::srfp_mapping == m_type )
  {
    if (mesh.HasSurfaceParameters())
    {
      // uv textures from surface parameterization
      T.Reserve(mesh.m_V.Count());
      T.SetCount(mesh.m_V.Count());
      T.Zero();
      rc = GetSPTCHelper(mesh, *this, &T[0].x, 2);
    }
    else
    {
      //In this case, we're just going to leave the TC array in place
      rc = false;
    }
  }
  else
  {
    T.SetCount(0);
	  ON_SimpleArray<ON_3fPoint> T3;
    if ( GetTextureCoordinates(mesh, T3, mesh_xform, false, Tside ) )
    {
      // copy T3d[] results to T[]
      ThreeToTwoHelper(T3,T);
      rc = true;
	  }
  }
	return rc;
}